

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix2 * matrix2_invert(matrix2 *self)

{
  matrix2 *pmVar1;
  long lVar2;
  matrix2 inverse;
  matrix2 local_18;
  
  pmVar1 = matrix2_inverse(self,&local_18);
  if (pmVar1 != (matrix2 *)0x0) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      (self->field_0).m[lVar2] = local_18.field_0.m[lVar2];
    }
  }
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_invert(struct matrix2 *self)
{
	struct matrix2 inverse;
	uint8_t i;

	if (matrix2_inverse(self, &inverse)) {
		for (i = 0; i < 4; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}